

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

void ctemplate_htmlparser::htmlparser_reset_mode(htmlparser_ctx *ctx,int mode)

{
  int mode_local;
  htmlparser_ctx *ctx_local;
  
  if (ctx != (htmlparser_ctx *)0x0) {
    statemachine_reset(ctx->statemachine);
    ctx->in_js = 0;
    ctx->tag[0] = '\0';
    ctx->attr[0] = '\0';
    ctx->value[0] = '\0';
    jsparser_reset(ctx->jsparser);
    switch(mode) {
    case 0:
      ctx->statemachine->current_state = 0;
      break;
    case 1:
      ctx->statemachine->current_state = 0x1d;
      ctx->in_js = 1;
      break;
    case 2:
      ctx->statemachine->current_state = 0x1e;
      break;
    case 3:
      ctx->statemachine->current_state = 0xb;
      break;
    default:
      __assert_fail("\"Invalid mode in htmlparser_reset_mode().\" && 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                    ,0x2a9,"void ctemplate_htmlparser::htmlparser_reset_mode(htmlparser_ctx *, int)"
                   );
    }
    return;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x291,"void ctemplate_htmlparser::htmlparser_reset_mode(htmlparser_ctx *, int)");
}

Assistant:

void htmlparser_reset_mode(htmlparser_ctx *ctx, int mode)
{
  assert(ctx != NULL);
  statemachine_reset(ctx->statemachine);
  ctx->in_js = 0;
  ctx->tag[0] = '\0';
  ctx->attr[0] = '\0';
  ctx->value[0] = '\0';

  jsparser_reset(ctx->jsparser);

  switch (mode) {
    case HTMLPARSER_MODE_HTML:
      ctx->statemachine->current_state = HTMLPARSER_STATE_INT_TEXT;
      break;
    case HTMLPARSER_MODE_JS:
      ctx->statemachine->current_state = HTMLPARSER_STATE_INT_JS_FILE;
      ctx->in_js = 1;
      break;
    case HTMLPARSER_MODE_CSS:
      ctx->statemachine->current_state = HTMLPARSER_STATE_INT_CSS_FILE;
      break;
    case HTMLPARSER_MODE_HTML_IN_TAG:
      ctx->statemachine->current_state = HTMLPARSER_STATE_INT_TAG_SPACE;
      break;
    default:
      assert("Invalid mode in htmlparser_reset_mode()." && 0);
  }
}